

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormat::setScientificNotation(DecimalFormat *this,UBool useScientific)

{
  DecimalFormatProperties *pDVar1;
  int iVar2;
  int32_t minExp;
  UBool useScientific_local;
  DecimalFormat *this_local;
  
  iVar2 = -1;
  if (useScientific != '\0') {
    iVar2 = 1;
  }
  pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                     ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                      this->fields);
  if (pDVar1->minimumExponentDigits != iVar2) {
    if (useScientific == '\0') {
      pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      pDVar1->minimumExponentDigits = -1;
    }
    else {
      pDVar1 = LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>::operator->
                         ((LocalPointerBase<icu_63::number::impl::DecimalFormatProperties> *)
                          this->fields);
      pDVar1->minimumExponentDigits = 1;
    }
    touchNoError(this);
  }
  return;
}

Assistant:

void DecimalFormat::setScientificNotation(UBool useScientific) {
    int32_t minExp = useScientific ? 1 : -1;
    if (fields->properties->minimumExponentDigits == minExp) { return; }
    if (useScientific) {
        fields->properties->minimumExponentDigits = 1;
    } else {
        fields->properties->minimumExponentDigits = -1;
    }
    touchNoError();
}